

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

void BZ2_hbAssignCodes(Int32 *code,UChar *length,Int32 minLen,Int32 maxLen,Int32 alphaSize)

{
  Int32 n;
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  if (minLen <= maxLen) {
    iVar1 = 0;
    do {
      if (0 < alphaSize) {
        uVar2 = 0;
        do {
          if (minLen == (uint)length[uVar2]) {
            code[uVar2] = iVar1;
            iVar1 = iVar1 + 1;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)alphaSize != uVar2);
      }
      iVar1 = iVar1 * 2;
      bVar3 = minLen != maxLen;
      minLen = minLen + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void BZ2_hbAssignCodes ( Int32 *code,
                         UChar *length,
                         Int32 minLen,
                         Int32 maxLen,
                         Int32 alphaSize )
{
   Int32 n, vec, i;

   vec = 0;
   for (n = minLen; n <= maxLen; n++) {
      for (i = 0; i < alphaSize; i++)
         if (length[i] == n) { code[i] = vec; vec++; };
      vec <<= 1;
   }
}